

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O3

void __thiscall Ym2612_Emu::write1(Ym2612_Emu *this,int addr,int data)

{
  Ym2612_Impl *this_00;
  
  if (0x2f < addr) {
    this_00 = this->impl;
    if ((this_00->YM2612).REG[1][(uint)addr] != data) {
      (this_00->YM2612).REG[1][(uint)addr] = data;
      if ((uint)addr < 0xa0) {
        Ym2612_Impl::SLOT_SET(this_00,addr | 0x100,data);
        return;
      }
      Ym2612_Impl::CHANNEL_SET(this_00,addr + 0x100,data);
      return;
    }
  }
  return;
}

Assistant:

inline void Ym2612_Impl::write1( int opn_addr, int data )
{
	assert( (unsigned) data <= 0xFF );
	
	if ( opn_addr >= 0x30 && YM2612.REG [1] [opn_addr] != data )
	{
		YM2612.REG [1] [opn_addr] = data;

		if ( opn_addr < 0xA0 )
			SLOT_SET( opn_addr + 0x100, data );
		else
			CHANNEL_SET( opn_addr + 0x100, data );
	}
}